

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::AsyncInputStream> __thiscall
kj::Own<kj::AsyncInputStream>::attach<kj::String,kj::Own<kj::HttpHeaders>>
          (Own<kj::AsyncInputStream> *this,String *attachments,Own<kj::HttpHeaders> *attachments_1)

{
  AsyncInputStream *pAVar1;
  DisposableOwnedBundle<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
  *this_00;
  AsyncInputStream *pAVar2;
  Own<kj::HttpHeaders> *in_RCX;
  AsyncInputStream *extraout_RDX;
  Own<kj::AsyncInputStream> OVar3;
  
  pAVar1 = (AsyncInputStream *)(attachments->content).size_;
  this_00 = (DisposableOwnedBundle<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
             *)operator_new(0x40);
  _::DisposableOwnedBundle<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>::
  DisposableOwnedBundle
            (this_00,(Own<kj::AsyncInputStream> *)attachments,(String *)attachments_1,in_RCX);
  pAVar2 = (AsyncInputStream *)0x1;
  if (pAVar1 != (AsyncInputStream *)0x0) {
    pAVar2 = pAVar1;
  }
  this->disposer = (Disposer *)this_00;
  this->ptr = pAVar2;
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<T> Own<T>::attach(Attachments&&... attachments) {
  T* ptrCopy = ptr;

  KJ_IREQUIRE(ptrCopy != nullptr, "cannot attach to null pointer");

  // HACK: If someone accidentally calls .attach() on a null pointer in opt mode, try our best to
  //   accomplish reasonable behavior: We turn the pointer non-null but still invalid, so that the
  //   disposer will still be called when the pointer goes out of scope.
  if (ptrCopy == nullptr) ptrCopy = reinterpret_cast<T*>(1);

  auto bundle = new _::DisposableOwnedBundle<Own<T>, Attachments...>(
      kj::mv(*this), kj::fwd<Attachments>(attachments)...);
  return Own<T>(ptrCopy, *bundle);
}